

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::writeTrailer
          (QPDFWriter *this,trailer_e which,int size,bool xref_stream,qpdf_offset_t prev,
          int linearization_pass)

{
  element_type *peVar1;
  Count *pCVar2;
  string *psVar3;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  size_type *psVar7;
  unsigned_long nspaces;
  undefined7 in_register_00000009;
  string *this_00;
  undefined1 *puVar8;
  bool bVar9;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  string_view str_25;
  string_view str_26;
  string original_id1;
  undefined1 local_100 [36];
  int local_dc;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  QPDFObjGen local_78;
  QPDFObjectHandle trailer;
  undefined1 local_60 [32];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = &original_id1;
  local_78 = (QPDFObjGen)prev;
  getTrimmedTrailer((QPDFWriter *)&trailer);
  if ((int)CONCAT71(in_register_00000009,xref_stream) == 0) {
    str._M_str = "trailer <<";
    str._M_len = 10;
    writeString(this,str);
  }
  else {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar1->cur_data_key)._M_string_length = 0;
    *(peVar1->cur_data_key)._M_dataplus._M_p = '\0';
  }
  str_00._M_str = "\n";
  str_00._M_len = 1;
  writeStringQDF(this,str_00);
  if (which == t_lin_second) {
    str_01._M_str = " /Size ";
    str_01._M_len = 7;
    writeString(this,str_01);
    std::__cxx11::to_string(&original_id1,size);
    str_02._M_str = original_id1._M_dataplus._M_p;
    str_02._M_len = original_id1._M_string_length;
    writeString(this,str_02);
    std::__cxx11::string::~string((string *)&original_id1);
  }
  else {
    local_dc = linearization_pass;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&trailer);
    iVar5 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)local_100);
    iVar6 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)local_100);
    for (; iVar5._M_node != iVar6._M_node;
        iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar5._M_node)) {
      bVar9 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar5._M_node + 2));
      if (!bVar9) {
        str_03._M_str = "  ";
        str_03._M_len = 2;
        writeStringQDF(this,str_03);
        str_04._M_str = " ";
        str_04._M_len = 1;
        writeStringNoQDF(this,str_04);
        ::qpdf::Name::normalize(&original_id1,(string *)(iVar5._M_node + 1));
        str_05._M_str = original_id1._M_dataplus._M_p;
        str_05._M_len = original_id1._M_string_length;
        writeString(this,str_05);
        std::__cxx11::string::~string((string *)&original_id1);
        str_06._M_str = " ";
        str_06._M_len = 1;
        writeString(this,str_06);
        bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar5._M_node + 1),"/Size");
        if (bVar9) {
          std::__cxx11::to_string(&original_id1,size);
          str_07._M_str = original_id1._M_dataplus._M_p;
          str_07._M_len = original_id1._M_string_length;
          writeString(this,str_07);
          std::__cxx11::string::~string((string *)&original_id1);
          if (which == t_lin_first) {
            str_08._M_str = " /Prev ";
            str_08._M_len = 7;
            writeString(this,str_08);
            pCVar2 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline;
            psVar3 = pCVar2->str;
            psVar7 = (size_type *)&pCVar2->count;
            if (psVar3 != (string *)0x0) {
              psVar7 = &psVar3->_M_string_length;
            }
            sVar4 = *psVar7;
            std::__cxx11::to_string(&original_id1,(longlong)local_78);
            str_09._M_str = original_id1._M_dataplus._M_p;
            str_09._M_len = original_id1._M_string_length;
            writeString(this,str_09);
            std::__cxx11::string::~string((string *)&original_id1);
            pCVar2 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->pipeline;
            psVar3 = pCVar2->str;
            psVar7 = (size_type *)&pCVar2->count;
            if (psVar3 != (string *)0x0) {
              psVar7 = &psVar3->_M_string_length;
            }
            original_id1._M_dataplus._M_p = (pointer)((sVar4 - *psVar7) + 0x15);
            nspaces = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                                ((longlong *)&original_id1);
            writePad(this,nspaces);
          }
        }
        else {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar5._M_node + 2));
          unparseChild(this,(QPDFObjectHandle *)&local_40,1,0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        }
        str_10._M_str = "\n";
        str_10._M_len = 1;
        writeStringQDF(this,str_10);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    linearization_pass = local_dc;
  }
  str_11._M_str = " ";
  str_11._M_len = 1;
  writeStringQDF(this,str_11);
  str_12._M_str = " /ID [";
  str_12._M_len = 6;
  writeString(this,str_12);
  if (linearization_pass == 0) {
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        deterministic_id == true) {
      computeDeterministicIDData(this);
    }
  }
  else if (linearization_pass == 1) {
    getOriginalID1_abi_cxx11_(&original_id1,this);
    if (original_id1._M_string_length == 0) {
      str_16._M_str = "<00000000000000000000000000000000>";
      str_16._M_len = 0x22;
      writeString(this,str_16);
    }
    else {
      str_13._M_str = "<";
      str_13._M_len = 1;
      writeString(this,str_13);
      std::__cxx11::string::string((string *)(local_a8 + 0x10),(string *)&original_id1);
      local_60._0_8_ = local_60 + 0x10;
      if ((undefined1 *)local_a8._16_8_ == local_88) {
        local_60._24_8_ = local_88._8_8_;
      }
      else {
        local_60._0_8_ = local_a8._16_8_;
      }
      local_60._8_8_ = local_a8._24_8_;
      local_a8._24_8_ = 0;
      local_88[0] = 0;
      local_a8._16_8_ = local_88;
      QPDF_String::unparse_abi_cxx11_((string *)local_100,(QPDF_String *)local_60,true);
      puVar8 = (undefined1 *)
               ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_100._8_8_ + -0x10))->
                       _M_weak_count + 2);
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)(local_a8 + 0x10));
      while (bVar9 = puVar8 != (undefined1 *)0x0, puVar8 = puVar8 + -1, bVar9) {
        str_17._M_str = "0";
        str_17._M_len = 1;
        writeString(this,str_17);
      }
      str_18._M_str = ">";
      str_18._M_len = 1;
      writeString(this,str_18);
    }
    str_19._M_str = "<00000000000000000000000000000000>";
    str_19._M_len = 0x22;
    writeString(this,str_19);
    goto LAB_001b79ed;
  }
  generateID(this);
  std::__cxx11::string::string
            ((string *)(local_c8 + 0x10),
             (string *)
             &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->id1);
  if ((element_type *)local_c8._16_8_ == (element_type *)local_a8) {
    local_100._24_8_ = local_a8._8_8_;
    local_100._0_8_ = (element_type *)(local_100 + 0x10);
  }
  else {
    local_100._0_8_ = local_c8._16_8_;
  }
  local_100._8_8_ = local_c8._24_8_;
  local_c8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8[0] = 0;
  local_c8._16_8_ = (element_type *)local_a8;
  QPDF_String::unparse_abi_cxx11_(&original_id1,(QPDF_String *)local_100,true);
  str_14._M_str = original_id1._M_dataplus._M_p;
  str_14._M_len = original_id1._M_string_length;
  writeString(this,str_14);
  std::__cxx11::string::~string((string *)&original_id1);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)(local_c8 + 0x10));
  std::__cxx11::string::string
            ((string *)&local_d8,
             (string *)
             &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->id2);
  if (local_d8 == (element_type *)local_c8) {
    local_100._24_8_ = local_c8._8_8_;
    local_100._0_8_ = (element_type *)(local_100 + 0x10);
  }
  else {
    local_100._0_8_ = local_d8;
  }
  local_100._8_8_ = local_d0;
  local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8[0] = 0;
  local_d8 = (element_type *)local_c8;
  QPDF_String::unparse_abi_cxx11_(&original_id1,(QPDF_String *)local_100,true);
  str_15._M_str = original_id1._M_dataplus._M_p;
  str_15._M_len = original_id1._M_string_length;
  writeString(this,str_15);
  std::__cxx11::string::~string((string *)&original_id1);
  std::__cxx11::string::~string((string *)local_100);
  this_00 = (string *)&local_d8;
LAB_001b79ed:
  std::__cxx11::string::~string((string *)this_00);
  str_20._M_str = "]";
  str_20._M_len = 1;
  writeString(this,str_20);
  if ((which != t_lin_second) &&
     (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      encrypted == true)) {
    str_21._M_str = " /Encrypt ";
    str_21._M_len = 10;
    writeString(this,str_21);
    std::__cxx11::to_string
              (&original_id1,
               ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->encryption_dict_objid);
    str_22._M_str = original_id1._M_dataplus._M_p;
    str_22._M_len = original_id1._M_string_length;
    writeString(this,str_22);
    std::__cxx11::string::~string((string *)&original_id1);
    str_23._M_str = " 0 R";
    str_23._M_len = 4;
    writeString(this,str_23);
  }
  str_24._M_str = "\n";
  str_24._M_len = 1;
  writeStringQDF(this,str_24);
  str_25._M_str = " ";
  str_25._M_len = 1;
  writeStringNoQDF(this,str_25);
  str_26._M_str = ">>";
  str_26._M_len = 2;
  writeString(this,str_26);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFWriter::writeTrailer(
    trailer_e which, int size, bool xref_stream, qpdf_offset_t prev, int linearization_pass)
{
    QPDFObjectHandle trailer = getTrimmedTrailer();
    if (xref_stream) {
        m->cur_data_key.clear();
    } else {
        writeString("trailer <<");
    }
    writeStringQDF("\n");
    if (which == t_lin_second) {
        writeString(" /Size ");
        writeString(std::to_string(size));
    } else {
        for (auto const& [key, value]: trailer.as_dictionary()) {
            if (value.null()) {
                continue;
            }
            writeStringQDF("  ");
            writeStringNoQDF(" ");
            writeString(Name::normalize(key));
            writeString(" ");
            if (key == "/Size") {
                writeString(std::to_string(size));
                if (which == t_lin_first) {
                    writeString(" /Prev ");
                    qpdf_offset_t pos = m->pipeline->getCount();
                    writeString(std::to_string(prev));
                    writePad(QIntC::to_size(pos - m->pipeline->getCount() + 21));
                }
            } else {
                unparseChild(value, 1, 0);
            }
            writeStringQDF("\n");
        }
    }

    // Write ID
    writeStringQDF(" ");
    writeString(" /ID [");
    if (linearization_pass == 1) {
        std::string original_id1 = getOriginalID1();
        if (original_id1.empty()) {
            writeString("<00000000000000000000000000000000>");
        } else {
            // Write a string of zeroes equal in length to the representation of the original ID.
            // While writing the original ID would have the same number of bytes, it would cause a
            // change to the deterministic ID generated by older versions of the software that
            // hard-coded the length of the ID to 16 bytes.
            writeString("<");
            size_t len = QPDF_String(original_id1).unparse(true).length() - 2;
            for (size_t i = 0; i < len; ++i) {
                writeString("0");
            }
            writeString(">");
        }
        writeString("<00000000000000000000000000000000>");
    } else {
        if ((linearization_pass == 0) && (m->deterministic_id)) {
            computeDeterministicIDData();
        }
        generateID();
        writeString(QPDF_String(m->id1).unparse(true));
        writeString(QPDF_String(m->id2).unparse(true));
    }
    writeString("]");

    if (which != t_lin_second) {
        // Write reference to encryption dictionary
        if (m->encrypted) {
            writeString(" /Encrypt ");
            writeString(std::to_string(m->encryption_dict_objid));
            writeString(" 0 R");
        }
    }

    writeStringQDF("\n");
    writeStringNoQDF(" ");
    writeString(">>");
}